

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

MapCallStatistics *
deqp::gles3::Performance::anon_unknown_1::calculateSampleStatistics
          (MapCallStatistics *__return_storage_ptr__,LineParametersWithConfidence *fit,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
          *samples)

{
  pointer pUVar1;
  ulong uVar2;
  long lVar3;
  pointer pfVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  deUint64 *pdVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  size_type __n;
  ulong uVar11;
  pointer pfVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_91;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_60 [20];
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_90);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 6;
  uVar9 = (uint)__n;
  if (0 < (int)uVar9) {
    pdVar7 = &(pUVar1->duration).fitResponseDuration;
    uVar11 = 0;
    do {
      *(deUint64 *)(local_60._0_8_ + uVar11 * 8) = *pdVar7;
      uVar11 = uVar11 + 1;
      pdVar7 = pdVar7 + 8;
    } while ((uVar9 & 0x7fffffff) != uVar11);
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_90,__n,&local_91);
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (uint)((ulong)((long)(samples->
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6);
  if (0 < (int)uVar9) {
    piVar8 = &pUVar1->writtenSize;
    uVar11 = 0;
    do {
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] =
           (float)*piVar8 / (((float)*(ulong *)(local_60._0_8_ + uVar11 * 8) / 1000.0) / 1000.0);
      uVar11 = uVar11 + 1;
      piVar8 = piVar8 + 0x10;
    } while ((uVar9 & 0x7fffffff) != uVar11);
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar11 = (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar12,pfVar4);
    pfVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78._0_4_ =
       (float)(((long)pfVar12 -
                (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) - 1) * 0.5;
  fVar13 = floorf((float)local_78._0_4_);
  __return_storage_ptr__->medianRate =
       (1.0 - ((float)local_78._0_4_ - (float)(int)fVar13)) * pfVar4[(int)fVar13] +
       ((float)local_78._0_4_ - (float)(int)fVar13) * pfVar4[(int)fVar13 + 1];
  operator_delete(pfVar4,(long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)pfVar4);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_90,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,&local_91);
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (uint)((ulong)((long)(samples->
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6);
  if (0 < (int)uVar9) {
    piVar8 = &pUVar1->writtenSize;
    uVar11 = 0;
    do {
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] =
           (float)*(ulong *)(local_60._0_8_ + uVar11 * 8) -
           ((float)*piVar8 * fit->coefficient + fit->offset);
      uVar11 = uVar11 + 1;
      piVar8 = piVar8 + 0x10;
    } while ((uVar9 & 0x7fffffff) != uVar11);
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar11 = (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar12,pfVar4);
  }
  pfVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->maxDiffTime =
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  fVar13 = (float)(((long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1);
  local_78._4_4_ = fVar13 * 0.5;
  local_78._0_4_ = fVar13 * 0.9;
  fStack_70 = fVar13 * 0.0;
  fStack_6c = fVar13 * 0.0;
  local_48 = floorf(fVar13 * 0.9);
  fVar13 = floorf((float)local_78._4_4_);
  iVar14 = (int)local_48;
  iVar15 = (int)fVar13;
  fVar13 = pfVar12[iVar15 + 1];
  fVar16 = pfVar12[iVar15];
  __return_storage_ptr__->maxDiff9DecileTime =
       pfVar12[iVar14] * (1.0 - ((float)local_78._0_4_ - (float)iVar14)) +
       pfVar12[iVar14 + 1] * ((float)local_78._0_4_ - (float)iVar14);
  __return_storage_ptr__->medianDiffTime =
       fVar16 * (1.0 - ((float)local_78._4_4_ - (float)iVar15)) +
       fVar13 * ((float)local_78._4_4_ - (float)iVar15);
  operator_delete(pfVar12,(long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - (long)pfVar12);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_90,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,&local_91);
  pfVar4 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar12 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (uint)((ulong)((long)(samples->
                               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6);
  if (0 < (int)uVar9) {
    piVar8 = &pUVar1->writtenSize;
    uVar11 = 0;
    do {
      fVar13 = (float)*piVar8 * fit->coefficient + fit->offset;
      fVar16 = 0.0;
      if (1.0 <= fVar13) {
        fVar16 = ((float)*(ulong *)(local_60._0_8_ + uVar11 * 8) - fVar13) / fVar13;
      }
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = fVar16;
      uVar11 = uVar11 + 1;
      piVar8 = piVar8 + 0x10;
    } while ((uVar9 & 0x7fffffff) != uVar11);
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar11 = (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar12,pfVar4);
  }
  __return_storage_ptr__->maxRelDiffTime =
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  fVar13 = (float)(((long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1);
  local_78._4_4_ = fVar13 * 0.5;
  local_78._0_4_ = fVar13 * 0.9;
  fStack_70 = fVar13 * 0.0;
  fStack_6c = fVar13 * 0.0;
  local_48 = floorf(fVar13 * 0.9);
  fVar13 = floorf((float)local_78._4_4_);
  iVar14 = (int)local_48;
  iVar15 = (int)fVar13;
  fVar13 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[iVar15 + 1];
  fVar16 = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[iVar15];
  __return_storage_ptr__->max9DecileRelDiffTime =
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar14] * (1.0 - ((float)local_78._0_4_ - (float)iVar14)) +
       local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar14 + 1] * ((float)local_78._0_4_ - (float)iVar14);
  __return_storage_ptr__->medianRelDiffTime =
       fVar16 * (1.0 - ((float)local_78._4_4_ - (float)iVar15)) +
       fVar13 * ((float)local_78._4_4_ - (float)iVar15);
  operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
  uVar6 = local_60._8_8_;
  uVar5 = local_60._0_8_;
  if (local_60._0_8_ != local_60._8_8_) {
    uVar11 = (long)(local_60._8_8_ - local_60._0_8_) >> 3;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_60._0_8_,local_60._8_8_,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,uVar6);
  }
  uVar5 = local_60._0_8_;
  (__return_storage_ptr__->result).minTime = (float)*(ulong *)local_60._0_8_;
  (__return_storage_ptr__->result).maxTime = (float)*(ulong *)(local_60._8_8_ + -8);
  fStack_3c = (float)(((long)(local_60._8_8_ - local_60._0_8_) >> 3) - 1);
  _local_78 = ZEXT416((uint)fStack_3c);
  local_48 = fStack_3c * 0.5;
  fStack_44 = fStack_3c * 0.1;
  fStack_40 = fStack_3c * 0.0;
  fStack_3c = fStack_3c * 0.0;
  local_38 = floorf(local_48);
  fVar13 = floorf(fStack_44);
  iVar14 = (int)local_38;
  iVar15 = (int)fVar13;
  uVar11 = *(ulong *)(uVar5 + (long)iVar15 * 8);
  uVar10 = *(ulong *)(uVar5 + (long)(iVar15 + 1) * 8);
  (__return_storage_ptr__->result).medianTime =
       (float)*(ulong *)(uVar5 + (long)(iVar14 + 1) * 8) * (local_48 - (float)iVar14) +
       (float)*(ulong *)(uVar5 + (long)iVar14 * 8) * (1.0 - (local_48 - (float)iVar14));
  (__return_storage_ptr__->result).min2DecileTime =
       (float)uVar10 * (fStack_44 - (float)iVar15) +
       (float)uVar11 * (1.0 - (fStack_44 - (float)iVar15));
  local_78._0_4_ = (float)local_78._0_4_ * 0.9;
  fVar13 = floorf((float)local_78._0_4_);
  uVar11 = *(ulong *)(uVar5 + (long)(int)fVar13 * 8);
  uVar10 = uVar11;
  if ((long)uVar11 < 0) {
    uVar10 = (ulong)((uint)uVar11 & 1) | uVar11 >> 1;
  }
  uVar2 = *(ulong *)(uVar5 + (long)((int)fVar13 + 1) * 8);
  if ((long)uVar2 < 0) {
    uVar10 = uVar2 >> 1;
  }
  (__return_storage_ptr__->result).max9DecileTime =
       (float)uVar2 * ((float)local_78._0_4_ - (float)(int)fVar13) +
       (float)uVar11 * (1.0 - ((float)local_78._0_4_ - (float)(int)fVar13));
  operator_delete((void *)uVar5,CONCAT44(uStack_4c,local_60._16_4_) - uVar5);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            ((SingleOperationStatistics *)local_60,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x0,uVar10);
  (__return_storage_ptr__->map).max9DecileTime = (float)local_60._16_4_;
  (__return_storage_ptr__->map).minTime = (float)local_60._0_4_;
  (__return_storage_ptr__->map).maxTime = (float)local_60._4_4_;
  (__return_storage_ptr__->map).medianTime = (float)local_60._8_4_;
  (__return_storage_ptr__->map).min2DecileTime = (float)local_60._12_4_;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            ((SingleOperationStatistics *)local_60,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x8,uVar10);
  (__return_storage_ptr__->unmap).max9DecileTime = (float)local_60._16_4_;
  (__return_storage_ptr__->unmap).minTime = (float)local_60._0_4_;
  (__return_storage_ptr__->unmap).maxTime = (float)local_60._4_4_;
  (__return_storage_ptr__->unmap).medianTime = (float)local_60._8_4_;
  (__return_storage_ptr__->unmap).min2DecileTime = (float)local_60._12_4_;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            ((SingleOperationStatistics *)local_60,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)&DAT_00000010,uVar10);
  (__return_storage_ptr__->write).max9DecileTime = (float)local_60._16_4_;
  (__return_storage_ptr__->write).minTime = (float)local_60._0_4_;
  (__return_storage_ptr__->write).maxTime = (float)local_60._4_4_;
  (__return_storage_ptr__->write).medianTime = (float)local_60._8_4_;
  (__return_storage_ptr__->write).min2DecileTime = (float)local_60._12_4_;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>>
            ((SingleOperationStatistics *)local_60,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)0x18,uVar10);
  (__return_storage_ptr__->alloc).max9DecileTime = (float)local_60._16_4_;
  (__return_storage_ptr__->alloc).minTime = (float)local_60._0_4_;
  (__return_storage_ptr__->alloc).maxTime = (float)local_60._4_4_;
  (__return_storage_ptr__->alloc).medianTime = (float)local_60._8_4_;
  (__return_storage_ptr__->alloc).min2DecileTime = (float)local_60._12_4_;
  return (MapCallStatistics *)(ulong)(uint)local_60._16_4_;
}

Assistant:

static MapCallStatistics calculateSampleStatistics (const LineParametersWithConfidence& fit, const std::vector<UploadSampleResult<MapBufferRangeDuration> >& samples)
{
	MapCallStatistics stats;

	calculateBasicTransferStatistics(stats, fit, samples);

	stats.map	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::mapDuration);
	stats.unmap	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::unmapDuration);
	stats.write	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::writeDuration);
	stats.alloc	= calculateSingleOperationStatistics(samples, &MapBufferRangeDuration::allocDuration);

	return stats;
}